

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sighash_tests.cpp
# Opt level: O1

void __thiscall sighash_tests::sighash_from_data::test_method(sighash_from_data *this)

{
  uint uVar1;
  readonly_property<bool> rVar2;
  uint nIn;
  uint nHashType;
  int iVar3;
  UniValue *pUVar4;
  long lVar5;
  UniValue *pUVar6;
  string *psVar7;
  ulong uVar8;
  size_t index;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  iterator in_R8;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *this_00;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  string_view jsondata;
  const_string file;
  string_view hex_str;
  Span<const_std::byte> sp;
  const_string file_00;
  const_string file_01;
  string_view hex_str_00;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  DataStream stream;
  CTransactionRef tx;
  TxValidationState state;
  uint256 sh;
  string sigHashHex;
  string raw_script;
  string raw_tx;
  string strTest;
  UniValue tests;
  check_type cVar14;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  assertion_result local_260;
  char **local_248;
  assertion_result local_240;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  shared_ptr<const_CTransaction> local_1e8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 local_1a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_188;
  _Alloc_hider local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined1 local_158 [28];
  uint uStack_13c;
  _func_int **local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_130;
  pointer local_128;
  undefined1 *puStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<UniValue,_std::allocator<UniValue>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  jsondata._M_str = json_tests::detail_sighash_bytes;
  jsondata._M_len = 0x33633;
  read_json((UniValue *)(local_b0 + 0x20),jsondata);
  if (local_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = 0;
    uVar12 = 1;
    do {
      pUVar4 = ::UniValue::operator[]((UniValue *)(local_b0 + 0x20),index);
      ::UniValue::write_abi_cxx11_((UniValue *)local_b0,(int)pUVar4,(void *)0x0,0);
      lVar5 = ((long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      if (lVar5 != 1) {
        if (lVar5 == 0) {
          local_1b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
          ;
          local_1a8 = "";
          local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
          file.m_end = (iterator)0xad;
          file.m_begin = (iterator)&local_1b0;
          msg.m_end = in_R9;
          msg.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c0,
                     msg);
          local_f0._M_dataplus._M_p = local_f0._M_dataplus._M_p & 0xffffffffffffff00;
          local_f0._M_string_length = 0;
          local_f0.field_2._M_allocated_capacity = 0;
          local_d0._8_8_ = local_d0._8_8_ & 0xffffffffffffff00;
          local_d0._0_8_ = &PTR__lazy_ostream_013d3800;
          local_c0._0_8_ = boost::unit_test::lazy_ostream::inst;
          local_c0._8_8_ = "Bad test: ";
          local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
          local_1a0._0_8_ = &PTR__lazy_ostream_013d3840;
          local_1a0._16_8_ = local_d0;
          aStack_188._M_allocated_capacity = (size_type)local_b0;
          local_1d0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
          ;
          local_1c8 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x1;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&local_f0,(lazy_ostream *)local_1a0,1,1,WARN,_cVar14,
                     (size_t)&local_1d0,0xad);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&local_f0.field_2._M_allocated_capacity);
        }
        else {
          local_d0._0_8_ = local_c0;
          local_d0._8_8_ = 0;
          local_c0._0_8_ = local_c0._0_8_ & 0xffffffffffffff00;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          local_f0._M_string_length = 0;
          local_f0.field_2._M_allocated_capacity =
               local_f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          local_110._M_string_length = 0;
          local_110.field_2._M_local_buf[0] = '\0';
          local_128 = (pointer)0x0;
          puStack_120 = (undefined1 *)0x0;
          local_138 = (_func_int **)0x0;
          paStack_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          local_1e8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (CTransaction *)0x0;
          local_1e8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_158._16_8_ = 0;
          stack0xfffffffffffffec0 = 0;
          local_158._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
          local_158._8_8_ = 0;
          pUVar6 = ::UniValue::operator[](pUVar4,0);
          psVar7 = ::UniValue::get_str_abi_cxx11_(pUVar6);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     psVar7);
          pUVar6 = ::UniValue::operator[](pUVar4,1);
          psVar7 = ::UniValue::get_str_abi_cxx11_(pUVar6);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_f0,psVar7);
          pUVar6 = ::UniValue::operator[](pUVar4,2);
          nIn = ::UniValue::getInt<int>(pUVar6);
          pUVar6 = ::UniValue::operator[](pUVar4,3);
          nHashType = ::UniValue::getInt<int>(pUVar6);
          pUVar4 = ::UniValue::operator[](pUVar4,4);
          psVar7 = ::UniValue::get_str_abi_cxx11_(pUVar4);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_110,psVar7);
          hex_str._M_str = (char *)local_d0._0_8_;
          hex_str._M_len = local_d0._8_8_;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,hex_str);
          sp.m_size = local_1a0._8_8_ - local_1a0._0_8_;
          sp.m_data = (byte *)local_1a0._0_8_;
          DataStream::DataStream((DataStream *)local_208,sp);
          if ((_func_int **)local_1a0._0_8_ != (_func_int **)0x0) {
            operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ - local_1a0._0_8_);
          }
          local_240._0_8_ = &::TX_WITH_WITNESS;
          local_240.m_message.px = (element_type *)local_208;
          Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
                    ((ParamsStream<DataStream_&,_TransactionSerParams> *)&local_240,&local_1e8);
          local_1a0._0_8_ = (_func_int **)0x0;
          local_1a0._8_8_ = &aStack_188;
          local_1a0._16_8_ = (pointer)0x0;
          aStack_188._M_allocated_capacity = aStack_188._M_allocated_capacity & 0xffffffffffffff00;
          local_178._M_p = (pointer)&local_168;
          local_170 = 0;
          local_168._M_local_buf[0] = '\0';
          local_218 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
          ;
          local_210 = "";
          local_228 = &boost::unit_test::basic_cstring<char_const>::null;
          local_220 = &boost::unit_test::basic_cstring<char_const>::null;
          file_00.m_end = (iterator)0xc4;
          file_00.m_begin = (iterator)&local_218;
          msg_00.m_end = in_R9;
          msg_00.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                     (size_t)&local_228,msg_00);
          rVar2.super_class_property<bool>.value =
               (class_property<bool>)
               CheckTransaction(local_1e8.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(TxValidationState *)local_1a0);
          local_240.m_message.px = (element_type *)0x0;
          local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_260.m_message.px =
               (element_type *)((ulong)local_260.m_message.px & 0xffffffffffffff00);
          local_260._0_8_ = &PTR__lazy_ostream_013d3bb0;
          local_260.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_248 = (char **)local_b0;
          local_270 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
          ;
          local_268 = "";
          pvVar10 = (iterator)0x1;
          pvVar11 = (iterator)0x1;
          local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)rVar2.super_class_property<bool>.value;
          boost::test_tools::tt_detail::report_assertion
                    (&local_240,(lazy_ostream *)&local_260,1,1,WARN,_cVar14,(size_t)&local_270,0xc4)
          ;
          boost::detail::shared_count::~shared_count(&local_240.m_message.pn);
          local_280 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
          ;
          local_278 = "";
          local_290 = &boost::unit_test::basic_cstring<char_const>::null;
          local_288 = &boost::unit_test::basic_cstring<char_const>::null;
          file_01.m_end = (iterator)0xc5;
          file_01.m_begin = (iterator)&local_280;
          msg_01.m_end = pvVar11;
          msg_01.m_begin = pvVar10;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_290,msg_01);
          local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)(local_1a0._0_4_ == M_VALID);
          local_240.m_message.px = (element_type *)0x0;
          local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_2a0 = "state.IsValid()";
          local_298 = "";
          local_260.m_message.px =
               (element_type *)((ulong)local_260.m_message.px & 0xffffffffffffff00);
          local_260._0_8_ = &PTR__lazy_ostream_013d3df0;
          local_260.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_248 = &local_2a0;
          local_2b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
          ;
          local_2a8 = "";
          boost::test_tools::tt_detail::report_assertion
                    (&local_240,(lazy_ostream *)&local_260,1,0,WARN,_cVar14,(size_t)&local_2b0,0xc5)
          ;
          boost::detail::shared_count::~shared_count(&local_240.m_message.pn);
          hex_str_00._M_str = local_f0._M_dataplus._M_p;
          hex_str_00._M_len = local_f0._M_string_length;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_260,hex_str_00)
          ;
          uVar1 = uStack_13c - 0x1d;
          if (uStack_13c < 0x1d) {
            uVar1 = uStack_13c;
          }
          ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_158._0_8_;
          if (uStack_13c < 0x1d) {
            ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_158;
          }
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          insert<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_158,
                     (uchar *)((long)&ppVar9->_union + (long)(int)uVar1),
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_260._0_8_,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_260.m_message.px);
          if ((_func_int **)local_260._0_8_ != (_func_int **)0x0) {
            operator_delete((void *)local_260._0_8_,
                            (long)local_260.m_message.pn.pi_ - local_260._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_p != &local_168) {
            operator_delete(local_178._M_p,
                            CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._8_8_ != &aStack_188) {
            operator_delete((void *)local_1a0._8_8_,(ulong)(aStack_188._M_allocated_capacity + 1));
          }
          this_00 = (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_208;
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    (this_00);
          local_208._0_8_ = (_func_int **)0x0;
          _cVar14 = CHECK_PRED;
          pvVar10 = (iterator)(ulong)nHashType;
          SignatureHash<CTransaction>
                    ((uint256 *)local_1a0,(CScript *)local_158,
                     local_1e8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,nIn,nHashType,(CAmount *)this_00,BASE,(PrecomputedTransactionData *)0x0)
          ;
          local_128 = (pointer)local_1a0._16_8_;
          puStack_120 = (undefined1 *)aStack_188._M_allocated_capacity;
          local_138 = (_func_int **)local_1a0._0_8_;
          paStack_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a0._8_8_;
          local_2f0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
          ;
          local_2e8 = "";
          local_300 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_02.m_end = (iterator)0xcf;
          file_02.m_begin = (iterator)&local_2f0;
          msg_02.m_end = (iterator)this_00;
          msg_02.m_begin = pvVar10;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                     (size_t)&local_300,msg_02);
          base_blob<256u>::GetHex_abi_cxx11_((string *)local_1a0,&local_138);
          if (local_1a0._8_8_ == local_110._M_string_length) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._8_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              bVar13 = true;
            }
            else {
              iVar3 = bcmp((void *)local_1a0._0_8_,local_110._M_dataplus._M_p,local_1a0._8_8_);
              bVar13 = iVar3 == 0;
            }
          }
          else {
            bVar13 = false;
          }
          local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)bVar13;
          local_260.m_message.px = (element_type *)0x0;
          local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_208[8] = false;
          local_208._0_8_ = &PTR__lazy_ostream_013d3bb0;
          local_1f8 = boost::unit_test::lazy_ostream::inst;
          local_1f0 = local_b0;
          local_310 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
          ;
          local_308 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x1;
          boost::test_tools::tt_detail::report_assertion
                    (&local_260,(lazy_ostream *)local_208,1,1,WARN,_cVar14,(size_t)&local_310,0xcf);
          boost::detail::shared_count::~shared_count((shared_count *)&local_260.m_message.pn);
          if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
            operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
          }
          if (0x1c < uStack_13c) {
            free((void *)local_158._0_8_);
            local_158._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
          }
          if (local_1e8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1e8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,
                            CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                     local_110.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_d0._0_8_ != local_c0) {
            operator_delete((void *)local_d0._0_8_,(ulong)(local_c0._0_8_ + 1));
          }
        }
      }
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      uVar8 = ((long)local_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      bVar13 = uVar12 <= uVar8;
      lVar5 = uVar8 - uVar12;
      index = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar13 && lVar5 != 0);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if (local_88 != &local_78) {
    operator_delete(local_88,(ulong)(local_78._M_allocated_capacity + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sighash_from_data)
{
    UniValue tests = read_json(json_tests::sighash);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test.size() < 1) // Allow for extra stuff (useful for comments)
        {
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }
        if (test.size() == 1) continue; // comment

        std::string raw_tx, raw_script, sigHashHex;
        int nIn, nHashType;
        uint256 sh;
        CTransactionRef tx;
        CScript scriptCode = CScript();

        try {
          // deserialize test data
          raw_tx = test[0].get_str();
          raw_script = test[1].get_str();
          nIn = test[2].getInt<int>();
          nHashType = test[3].getInt<int>();
          sigHashHex = test[4].get_str();

          DataStream stream(ParseHex(raw_tx));
          stream >> TX_WITH_WITNESS(tx);

          TxValidationState state;
          BOOST_CHECK_MESSAGE(CheckTransaction(*tx, state), strTest);
          BOOST_CHECK(state.IsValid());

          std::vector<unsigned char> raw = ParseHex(raw_script);
          scriptCode.insert(scriptCode.end(), raw.begin(), raw.end());
        } catch (...) {
          BOOST_ERROR("Bad test, couldn't deserialize data: " << strTest);
          continue;
        }

        sh = SignatureHash(scriptCode, *tx, nIn, nHashType, 0, SigVersion::BASE);
        BOOST_CHECK_MESSAGE(sh.GetHex() == sigHashHex, strTest);
    }
}